

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O3

void __thiscall jbcoin::STLedgerEntry::STLedgerEntry(STLedgerEntry *this,Keylet *k)

{
  atomic<int> *paVar1;
  LedgerEntryType LVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Counter *pCVar6;
  Counter *pCVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d3040;
  (this->super_STObject).super_STBase.fName = (SField *)sfLedgerEntry;
  pCVar6 = CountedObject<jbcoin::STObject>::getCounter();
  LOCK();
  paVar1 = &(pCVar6->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STObject_002d31a0;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_STObject).mType = (SOTemplate *)0x0;
  pCVar7 = CountedObject<jbcoin::STLedgerEntry>::getCounter();
  LOCK();
  paVar1 = &(pCVar7->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STLedgerEntry_002d3138;
  uVar3 = *(undefined8 *)((k->key).pn + 2);
  uVar4 = *(undefined8 *)((k->key).pn + 4);
  uVar5 = *(undefined8 *)((k->key).pn + 6);
  *(undefined8 *)(this->key_).pn = *(undefined8 *)(k->key).pn;
  *(undefined8 *)((this->key_).pn + 2) = uVar3;
  *(undefined8 *)((this->key_).pn + 4) = uVar4;
  *(undefined8 *)((this->key_).pn + 6) = uVar5;
  this->type_ = k->type;
  LedgerFormats::getInstance();
  if (LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    LVar2 = this->type_;
    p_Var8 = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (LVar2 <= (int)p_Var9[1]._M_color) {
        p_Var8 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < LVar2];
    } while (p_Var9 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 !=
          &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
           _M_t._M_impl.super__Rb_tree_header) && ((int)p_Var8[1]._M_color <= LVar2)) &&
       ((SOTemplate *)p_Var8[1]._M_parent != (SOTemplate *)0x0)) {
      STObject::set(&this->super_STObject,(SOTemplate *)p_Var8[1]._M_parent);
      STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_short>,unsigned_short>
                (&this->super_STObject,(SField *)&sfLedgerEntryType,(short)this->type_);
      return;
    }
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

STLedgerEntry::STLedgerEntry (Keylet const& k)
    :  STObject(sfLedgerEntry)
    , key_ (k.key)
    , type_ (k.type)
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    set (format->elements);

    setFieldU16 (sfLedgerEntryType,
        static_cast <std::uint16_t> (type_));
}